

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O2

floatx80 addFloatx80Sigs(floatx80 a,floatx80 b,flag zSign)

{
  floatx80 fVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  floatx80 a_00;
  floatx80 fVar8;
  bits64 bSig;
  bits64 aSig;
  bits64 local_48;
  ulong local_40;
  bits64 local_38;
  uint local_2c;
  
  uVar5 = b.low;
  a_00.low = a.low;
  fVar8.low = a_00.low;
  fVar8._0_8_ = a._0_8_ & 0xffffffff;
  uVar7 = a._0_4_ & 0x7fff;
  uVar6 = b._0_4_ & 0x7fff;
  iVar3 = uVar7 - uVar6;
  local_40 = uVar5;
  local_38 = a_00.low;
  if (iVar3 == 0 || uVar7 < uVar6) {
    if (iVar3 < 0) {
      if (uVar6 == 0x7fff) {
        if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
          fVar1._4_4_ = 0;
          fVar1._0_4_ = (uint)(byte)zSign << 0xf | 0x7fff;
          fVar1.low = 0x8000000000000000;
          return fVar1;
        }
        goto LAB_00338373;
      }
      shift64ExtraRightJamming
                (a_00.low,0,
                 -(short)iVar3 -
                 (ushort)(((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
                 ,&local_38,&local_48);
      a_00.low = local_38;
      uVar7 = uVar6;
      goto LAB_003383a8;
    }
    if (uVar7 == 0x7fff) {
      lVar4 = (uVar5 | a_00.low) << 1;
      goto LAB_0033836a;
    }
    uVar5 = uVar5 + a_00.low;
    local_48 = uVar5;
    if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0) {
      normalizeFloatx80Subnormal(uVar5,(int32 *)&local_2c,&local_48);
      a_00.low = 0;
      uVar5 = local_48;
      goto LAB_0033841a;
    }
    uVar2 = 0;
  }
  else {
    if (uVar7 == 0x7fff) {
      lVar4 = a_00.low * 2;
LAB_0033836a:
      if (lVar4 == 0) {
        return fVar8;
      }
LAB_00338373:
      a_00._0_8_ = a._0_8_ & 0xffffffff;
      fVar8 = propagateFloatx80NaN(a_00,b);
      return fVar8;
    }
    shift64ExtraRightJamming
              (uVar5,0,(short)iVar3 -
                       (ushort)(((undefined1  [16])b & (undefined1  [16])0x7fff) ==
                               (undefined1  [16])0x0),&local_40,&local_48);
    uVar5 = local_40;
LAB_003383a8:
    uVar5 = uVar5 + a_00.low;
    a_00.low = local_48;
    local_2c = uVar7;
    if ((long)uVar5 < 0) goto LAB_0033841a;
    uVar2 = (ulong)(local_48 != 0);
  }
  a_00.low = uVar5 << 0x3f | uVar2;
  local_2c = uVar7 + 1;
  uVar5 = (uVar5 >> 1) + 0x8000000000000000;
LAB_0033841a:
  fVar8 = roundAndPackFloatx80(floatx80_rounding_precision,zSign,local_2c,uVar5,a_00.low);
  return fVar8;
}

Assistant:

static floatx80 addFloatx80Sigs( floatx80 a, floatx80 b, flag zSign )
{
	int32 aExp, bExp, zExp;
	bits64 aSig, bSig, zSig0, zSig1;
	int32 expDiff;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	bSig = extractFloatx80Frac( b );
	bExp = extractFloatx80Exp( b );
	expDiff = aExp - bExp;
	if ( 0 < expDiff ) {
		if ( aExp == 0x7FFF ) {
			if ( (bits64) ( aSig<<1 ) ) return propagateFloatx80NaN( a, b );
			return a;
		}
		if ( bExp == 0 ) --expDiff;
		shift64ExtraRightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
		zExp = aExp;
	}
	else if ( expDiff < 0 ) {
		if ( bExp == 0x7FFF ) {
			if ( (bits64) ( bSig<<1 ) ) return propagateFloatx80NaN( a, b );
			return packFloatx80( zSign, 0x7FFF, LIT64( 0x8000000000000000 ) );
		}
		if ( aExp == 0 ) ++expDiff;
		shift64ExtraRightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
		zExp = bExp;
	}
	else {
		if ( aExp == 0x7FFF ) {
			if ( (bits64) ( ( aSig | bSig )<<1 ) ) {
				return propagateFloatx80NaN( a, b );
			}
			return a;
		}
		zSig1 = 0;
		zSig0 = aSig + bSig;
		if ( aExp == 0 ) {
			normalizeFloatx80Subnormal( zSig0, &zExp, &zSig0 );
			goto roundAndPack;
		}
		zExp = aExp;
		goto shiftRight1;
	}
	zSig0 = aSig + bSig;
	if ( (sbits64) zSig0 < 0 ) goto roundAndPack;
	shiftRight1:
	shift64ExtraRightJamming( zSig0, zSig1, 1, &zSig0, &zSig1 );
	zSig0 |= LIT64( 0x8000000000000000 );
	++zExp;
	roundAndPack:
	return
		roundAndPackFloatx80(
			floatx80_rounding_precision, zSign, zExp, zSig0, zSig1 );

}